

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch_option.hpp
# Opt level: O0

void __thiscall Catch::Option<Catch::GroupInfo>::reset(Option<Catch::GroupInfo> *this)

{
  Option<Catch::GroupInfo> *this_local;
  
  if (this->nullableValue != (GroupInfo *)0x0) {
    GroupInfo::~GroupInfo(this->nullableValue);
  }
  this->nullableValue = (GroupInfo *)0x0;
  return;
}

Assistant:

void reset() {
            if( nullableValue )
                nullableValue->~T();
            nullableValue = CATCH_NULL;
        }